

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker_kernel_1.cpp
# Opt level: O1

int __thiscall dlib::linker::link(linker *this,char *__from,char *__to)

{
  mutex *__mutex;
  mutex *__mutex_00;
  mutex *__mutex_01;
  mutex *__mutex_02;
  bool bVar1;
  bool bVar2;
  int iVar3;
  threader *this_00;
  ssize_t sVar4;
  ostream *poVar5;
  fatal_error *this_01;
  error *peVar6;
  size_t in_RCX;
  int __how;
  int __how_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __how_01;
  int __how_02;
  int __how_03;
  int __how_04;
  int __how_05;
  uint uVar7;
  int __fd;
  pthread_mutex_t *__mutex_03;
  char buf [200];
  string local_1c8;
  undefined1 local_1a8 [24];
  uint auStack_190 [88];
  
  __mutex = &this->running_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  bVar2 = this->running;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar2 == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
    poVar5 = (ostream *)std::ostream::operator<<(local_1a8,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/linker/linker_kernel_1.cpp"
               ,0x67);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"void dlib::linker::link(connection &, connection &)",0x33);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"this->is_running() == false",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
    *(uint *)((long)auStack_190 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tvoid linker::link",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n\tis_running() == ",0x12);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    poVar5 = std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\tthis: ",8);
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    this_01 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(this_01,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(this_01,&fatal_error::typeinfo,error::~error);
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  this->running = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  __mutex_00 = &this->cons_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
  this->A = (connection *)__from;
  this->B = (connection *)__to;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
  __mutex_01 = &this->service_connection_running_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex_01);
  this->service_connection_running = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex_01);
  __mutex_02 = &this->service_connection_error_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex_02);
  this->service_connection_error = false;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex_02);
  this_00 = threads_kernel_shared::thread_pool();
  iVar3 = 0x241324;
  bVar2 = threads_kernel_shared::threader::create_new_thread(this_00,service_connection,this);
  if (!bVar2) {
    connection::shutdown((connection *)__from,iVar3,__how);
    connection::shutdown((connection *)__to,iVar3,__how_05);
    pthread_mutex_lock((pthread_mutex_t *)__mutex_01);
    this->service_connection_running = false;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_01);
    pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
    this->A = (connection *)0x0;
    this->B = (connection *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    this->running = false;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    peVar6 = (error *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"failed to make new thread in linker::link()","");
    error::error(peVar6,ECREATE_THREAD,(string *)local_1a8);
    *(undefined ***)peVar6 = &PTR__error_0031a6a0;
    __cxa_throw(peVar6,&thread_error::typeinfo,error::~error);
  }
  iVar3 = (int)local_1a8;
  while( true ) {
    __fd = iVar3;
    sVar4 = connection::read((connection *)__from,iVar3,(void *)0xc8,in_RCX);
    bVar2 = true;
    uVar7 = (uint)sVar4;
    if (uVar7 == 0xfffffffc) {
      connection::shutdown((connection *)__to,__fd,__how_00);
      __how_01 = extraout_EDX;
    }
    else {
      __how_01 = __how_00;
      if (uVar7 == 0xfffffffd) goto LAB_00240d4c;
    }
    if ((int)uVar7 < 1) break;
    __fd = iVar3;
    sVar4 = connection::write((connection *)__to,iVar3,(void *)(ulong)(uVar7 & 0x7fffffff),in_RCX);
    __how_01 = extraout_EDX_00;
    if ((int)sVar4 == -3) goto LAB_00240d4c;
    if ((int)sVar4 < 1) {
LAB_00240d49:
      bVar2 = false;
LAB_00240d4c:
      if (bVar2) {
        connection::shutdown((connection *)__from,__fd,__how_01);
        connection::shutdown((connection *)__to,__fd,__how_02);
      }
      pthread_mutex_lock((pthread_mutex_t *)__mutex_01);
      if (this->service_connection_running == true) {
        do {
          __mutex_03 = (this->service_connection_running_signaler).associated_mutex;
          pthread_cond_wait((pthread_cond_t *)&(this->service_connection_running_signaler).cond,
                            (pthread_mutex_t *)__mutex_03);
          __fd = (int)__mutex_03;
        } while (this->service_connection_running != false);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex_01);
      connection::shutdown((connection *)__from,__fd,__how_03);
      connection::shutdown((connection *)__to,__fd,__how_04);
      pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
      this->A = (connection *)0x0;
      this->B = (connection *)0x0;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
      pthread_mutex_lock((pthread_mutex_t *)__mutex_02);
      bVar1 = this->service_connection_error;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex_02);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      this->running = false;
      pthread_cond_broadcast((pthread_cond_t *)&(this->running_signaler).cond);
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if ((bVar2 | bVar1) == 1) {
        peVar6 = (error *)__cxa_allocate_exception(0x30);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,"a connection returned an error in linker::link()","");
        error::error(peVar6,ECONNECTION,&local_1c8);
        *(undefined ***)peVar6 = &PTR__error_0031a660;
        __cxa_throw(peVar6,&socket_error::typeinfo,error::~error);
      }
      return iVar3;
    }
  }
  if (uVar7 == 0) {
    connection::shutdown_outgoing((connection *)__to);
    __how_01 = extraout_EDX_01;
  }
  goto LAB_00240d49;
}

Assistant:

void linker::
    link (
        connection& a,
        connection& b
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( 
            this->is_running() == false ,
            "\tvoid linker::link"
            << "\n\tis_running() == " << this->is_running() 
            << "\n\tthis: " << this
            );

        running_mutex.lock();
        running = true;
        running_mutex.unlock();

        cons_mutex.lock();
        A = &a;
        B = &b;
        cons_mutex.unlock();

        

        service_connection_running_mutex.lock();
        service_connection_running = true;
        service_connection_running_mutex.unlock();

        service_connection_error_mutex.lock();
        service_connection_error = false;
        service_connection_error_mutex.unlock();

        // if we fail to make the thread
        if (!create_new_thread(service_connection,this))
        {
            a.shutdown();
            b.shutdown();

            service_connection_running_mutex.lock();
            service_connection_running = false;
            service_connection_running_mutex.unlock();

            cons_mutex.lock();
            A = 0;
            B = 0;
            cons_mutex.unlock();  

            running_mutex.lock();
            running = false;
            running_mutex.unlock();



            throw dlib::thread_error (
                ECREATE_THREAD,
                "failed to make new thread in linker::link()"
                );
        }



        // forward data from a to b
        char buf[200];
        int status;
        bool error = false; // becomes true if one of the connections returns an error
        while (true)
        {
            status = a.read(buf,sizeof(buf));
            // if there was an error reading from the socket
            if (status == OTHER_ERROR)
            {
                error = true;
                break;
            }
            else if (status == SHUTDOWN)
            {
                b.shutdown();
            }

            if (status <= 0)
            {
                // if a has closed normally
                if (status == 0)
                    b.shutdown_outgoing();
                break;            
            }

            status = b.write(buf,status);
            // if there was an error writing to the socket then break
            if (status == OTHER_ERROR)
            {
                error = true;
                break;
            }
            
            if (status <= 0)
                break;            
        }


        // if there was an error then shutdown both connections
        if (error)
        {
            a.shutdown();
            b.shutdown();
        }




        // wait for the other thread to end
        service_connection_running_mutex.lock();
        while(service_connection_running)
        {
            service_connection_running_signaler.wait();
        }
        service_connection_running_mutex.unlock();


        // make sure connections are shutdown
        a.shutdown();
        b.shutdown();


        // both threads have ended so the connections are no longer needed
        cons_mutex.lock();
        A = 0;
        B = 0;
        cons_mutex.unlock();


        // if service_connection terminated due to an error then set error to true
        service_connection_error_mutex.lock();
        if (service_connection_error)
            error = true;
        service_connection_error_mutex.unlock();


        // if we are ending because of an error
        if (error)
        {

            // signal that the link() function is ending
            running_mutex.lock();
            running = false;
            running_signaler.broadcast();
            running_mutex.unlock();

            // throw the exception for this error
            throw dlib::socket_error (
                ECONNECTION,
                "a connection returned an error in linker::link()"
                );
         
        }

        // signal that the link() function is ending
        running_mutex.lock();
        running = false;
        running_signaler.broadcast();
        running_mutex.unlock();
    }